

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O1

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n,double magnitude)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  string *this_00;
  double *pdVar4;
  ulong uVar5;
  uint __len;
  ulong __val;
  VectorXd temp;
  undefined1 local_88 [16];
  double local_78;
  double *pdStack_70;
  Index IStack_68;
  double *local_58;
  long local_50;
  double local_48 [2];
  double local_38;
  
  local_38 = magnitude;
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_001429d8;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_data = (double *)0x0;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_rows = 0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  __val = -n;
  if (0 < n) {
    __val = n;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_00129398;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_00129398;
      }
      if (uVar5 < 10000) goto LAB_00129398;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00129398:
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)__len - (char)(n >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_58 - (n >> 0x3f)),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1366f0);
  pdVar4 = (double *)(plVar3 + 2);
  if ((double *)*plVar3 == pdVar4) {
    local_78 = *pdVar4;
    pdStack_70 = (double *)plVar3[3];
    local_88._0_8_ = &local_78;
  }
  else {
    local_78 = *pdVar4;
    local_88._0_8_ = (double *)*plVar3;
  }
  local_88._8_8_ = plVar3[1];
  *plVar3 = (long)pdVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_88);
  if ((double *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (-1 < n) {
    if ((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != n) {
      free((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (n == 0) {
        pdVar4 = (double *)0x0;
      }
      else {
        pdVar4 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
      }
      (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = pdVar4;
    }
    (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = n;
    if ((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != n) {
      free((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (n == 0) {
        pdVar4 = (double *)0x0;
      }
      else {
        pdVar4 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
      }
      (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = pdVar4;
    }
    (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_rows = n;
    local_78 = local_38;
    local_88._0_8_ = n;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_88);
    pdStack_70 = (double *)0x0;
    IStack_68 = 0;
    local_88._0_8_ = local_58;
    local_88._8_8_ = local_50;
    if (-1 < local_50 || local_58 == (double *)0x0) {
      setTypicalMagnitude(this,(ConstRefVec *)local_88);
      free(pdStack_70);
      pdStack_70 = (double *)0x0;
      IStack_68 = 0;
      local_88._0_8_ = local_58;
      local_88._8_8_ = local_50;
      if (-1 < local_50 || local_58 == (double *)0x0) {
        setTrustMagnitude(this,(ConstRefVec *)local_88);
        free(pdStack_70);
        free(local_58);
        return;
      }
    }
    IStack_68 = 0;
    pdStack_70 = (double *)0x0;
    local_88._0_8_ = local_58;
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

RealSpace::RealSpace(Index n, double magnitude) : Manifold(n, n, n)
{
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  trustMagnitude_.resize(n);
  Eigen::VectorXd temp = Eigen::VectorXd::Constant(n, magnitude);
  setTypicalMagnitude(temp);
  setTrustMagnitude(temp);
}